

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

int ui_entry_combiner_lookup(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 9;
  iVar3 = 0;
  do {
    iVar2 = (iVar3 + iVar4) / 2;
    iVar1 = strcmp(combiners[iVar2].name,name);
    if (iVar1 == 0) {
      return iVar2 + 1;
    }
    if (iVar1 < 0) {
      iVar3 = iVar2 + 1;
      iVar2 = iVar4;
    }
    iVar4 = iVar2;
  } while (iVar3 != iVar4);
  return 0;
}

Assistant:

int ui_entry_combiner_lookup(const char *name)
{
	/* Sorted alphabetically so use a binary search. */
	int ilow = 0, ihigh = N_ELEMENTS(combiners);

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(combiners[imid].name, name);
		if (cmp == 0) {
			return imid + 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}